

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

uint LZ4HC_reverseCountPattern(BYTE *ip,BYTE *iLow,U32 pattern)

{
  U32 UVar1;
  BYTE *local_30;
  BYTE *bytePtr;
  BYTE *iStart;
  BYTE *pBStack_18;
  U32 pattern_local;
  BYTE *iLow_local;
  BYTE *ip_local;
  
  iStart._4_4_ = pattern;
  pBStack_18 = iLow;
  iLow_local = ip;
  while ((pBStack_18 + 4 <= iLow_local &&
         (UVar1 = LZ4_read32(iLow_local + -4), UVar1 == iStart._4_4_))) {
    iLow_local = iLow_local + -4;
  }
  local_30 = (BYTE *)((long)&iStart + 7);
  for (; (pBStack_18 < iLow_local && (iLow_local[-1] == *local_30)); iLow_local = iLow_local + -1) {
    local_30 = local_30 + -1;
  }
  return (int)ip - (int)iLow_local;
}

Assistant:

static unsigned
LZ4HC_reverseCountPattern(const BYTE* ip, const BYTE* const iLow, U32 pattern)
{
    const BYTE* const iStart = ip;

    while (likely(ip >= iLow+4)) {
        if (LZ4_read32(ip-4) != pattern) break;
        ip -= 4;
    }
    {   const BYTE* bytePtr = (const BYTE*)(&pattern) + 3; /* works for any endianess */
        while (likely(ip>iLow)) {
            if (ip[-1] != *bytePtr) break;
            ip--; bytePtr--;
    }   }
    return (unsigned)(iStart - ip);
}